

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalExport::Deserialize(LogicalExport *this,Deserializer *deserializer)

{
  int iVar1;
  LogicalExport *this_00;
  ClientContext *context;
  ParseInfo *pPVar2;
  ParseInfo *pPVar3;
  _Head_base<0UL,_duckdb::ParseInfo_*,_false> local_40;
  _Head_base<0UL,_duckdb::ParseInfo_*,_false> local_38;
  ParseInfo *local_30;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"copy_info");
  if ((char)iVar1 == '\0') {
    pPVar2 = (ParseInfo *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pPVar2 = (ParseInfo *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParseInfo::Deserialize((ParseInfo *)&local_30,deserializer);
      pPVar2 = local_30;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"exported_tables");
  if ((char)iVar1 == '\0') {
    pPVar3 = (ParseInfo *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pPVar3 = (ParseInfo *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParseInfo::Deserialize((ParseInfo *)&local_30,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pPVar3 = local_30;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (LogicalExport *)operator_new(0x328);
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  local_40._M_head_impl = pPVar3;
  local_38._M_head_impl = pPVar2;
  LogicalExport(this_00,context,
                (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
                &local_38,
                (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
                &local_40);
  if (local_40._M_head_impl != (ParseInfo *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ParseInfo[1])();
  }
  local_40._M_head_impl = (ParseInfo *)0x0;
  if (local_38._M_head_impl != (ParseInfo *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ParseInfo[1])();
  }
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalExport::Deserialize(Deserializer &deserializer) {
	auto copy_info = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(200, "copy_info");
	auto exported_tables = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(201, "exported_tables");
	auto result = duckdb::unique_ptr<LogicalExport>(new LogicalExport(deserializer.Get<ClientContext &>(), std::move(copy_info), std::move(exported_tables)));
	return std::move(result);
}